

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O3

void R_ClearPastViewer(AActor *actor)

{
  uint uVar1;
  InterpolationViewer *pIVar2;
  ulong uVar3;
  long lVar4;
  
  if (InterpolationPath.Count != 0) {
    InterpolationPath.Count = 0;
  }
  if (PastViewers.Count != 0) {
    lVar4 = 0;
    uVar3 = 0;
    pIVar2 = PastViewers.Array;
    uVar1 = PastViewers.Count;
    do {
      if (*(AActor **)((long)&pIVar2->ViewActor + lVar4) == actor) {
        TArray<InterpolationViewer,_InterpolationViewer>::Pop
                  (&PastViewers,(InterpolationViewer *)((long)&pIVar2->ViewActor + lVar4));
        pIVar2 = PastViewers.Array;
        uVar1 = PastViewers.Count;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x80;
    } while (uVar3 < uVar1);
  }
  return;
}

Assistant:

void R_ClearPastViewer (AActor *actor)
{
	InterpolationPath.Clear();
	for (unsigned int i = 0; i < PastViewers.Size(); ++i)
	{
		if (PastViewers[i].ViewActor == actor)
		{
			// Found it, so remove it.
			if (i == PastViewers.Size())
			{
				PastViewers.Delete (i);
			}
			else
			{
				PastViewers.Pop (PastViewers[i]);
			}
		}
	}
}